

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O3

void sip_round(siphash *H,int rounds)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  if (0 < rounds) {
    uVar1 = H->v0;
    uVar5 = H->v1;
    uVar3 = H->v3;
    uVar2 = H->v2;
    do {
      uVar1 = uVar1 + uVar5;
      uVar4 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
      uVar2 = uVar2 + uVar3;
      uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar2;
      uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
      uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
      uVar2 = uVar2 + uVar4;
      uVar5 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar2;
      uVar2 = uVar2 << 0x20 | uVar2 >> 0x20;
      rounds = rounds + -1;
    } while (rounds != 0);
    H->v1 = uVar5;
    H->v0 = uVar1;
    H->v3 = uVar3;
    H->v2 = uVar2;
  }
  return;
}

Assistant:

static void
sip_round(struct siphash *H, const int rounds) {
  int i;

  for (i = 0; i < rounds; i++) {
    H->v0 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 13);
    H->v1 ^= H->v0;
    H->v0 = SIP_ROTL(H->v0, 32);

    H->v2 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 16);
    H->v3 ^= H->v2;

    H->v0 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 21);
    H->v3 ^= H->v0;

    H->v2 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 17);
    H->v1 ^= H->v2;
    H->v2 = SIP_ROTL(H->v2, 32);
  }
}